

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::overstrike(Fl_Text_Display *this,char *text)

{
  char *pcVar1;
  char c;
  int pos;
  Fl_Text_Buffer *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int pos_00;
  size_t sVar7;
  char *pcVar8;
  
  pos = this->mCursorPos;
  this_00 = this->mBuffer;
  iVar3 = Fl_Text_Buffer::line_start(this_00,pos);
  sVar7 = strlen(text);
  iVar4 = Fl_Text_Buffer::count_displayed_characters(this->mBuffer,iVar3,pos);
  c = *text;
  pcVar8 = text;
  iVar3 = iVar4;
  while (c != '\0') {
    iVar3 = iVar3 + 1;
    iVar5 = fl_utf8len1(c);
    pcVar1 = pcVar8 + iVar5;
    pcVar8 = pcVar8 + iVar5;
    c = *pcVar1;
  }
  iVar5 = (int)sVar7;
  pos_00 = pos;
  if (pos == this_00->mLength) {
LAB_001d292b:
    pcVar8 = (char *)0x0;
  }
  else {
    iVar2 = iVar4;
    if (iVar4 <= iVar3) {
      iVar2 = iVar3;
    }
    do {
      uVar6 = Fl_Text_Buffer::char_at(this_00,pos_00);
      if (uVar6 == 10) break;
      if (iVar3 + -1 == iVar4) {
        pos_00 = pos_00 + 1;
        goto LAB_001d292b;
      }
      iVar4 = iVar4 + 1;
      if (iVar2 + 1 == iVar4) {
        iVar4 = 0;
        if (uVar6 == 9) goto LAB_001d292b;
        pcVar8 = (char *)operator_new__((long)(iVar5 + 0x15));
        strcpy(pcVar8,text);
        if (iVar3 < iVar2 + 1) {
          memset(pcVar8 + iVar5,0x20,(ulong)(uint)(iVar2 - iVar3) + 1);
          iVar4 = (iVar2 - iVar3) + 1;
        }
        pos_00 = pos_00 + 1;
        pcVar8[iVar4 + iVar5] = '\0';
        goto LAB_001d2930;
      }
      pos_00 = Fl_Text_Buffer::next_char(this->mBuffer,pos_00);
    } while (pos_00 != this_00->mLength);
    pcVar8 = (char *)0x0;
  }
LAB_001d2930:
  this->mCursorToHint = pos + iVar5;
  if (pcVar8 != (char *)0x0) {
    text = pcVar8;
  }
  Fl_Text_Buffer::replace(this_00,pos,pos_00,text);
  this->mCursorToHint = -1;
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
    return;
  }
  return;
}

Assistant:

void Fl_Text_Display::overstrike(const char* text) {
  IS_UTF8_ALIGNED2(buffer(), mCursorPos)
  IS_UTF8_ALIGNED(text)

  int startPos = mCursorPos;
  Fl_Text_Buffer *buf = mBuffer;
  int lineStart = buf->line_start( startPos );
  int textLen = (int) strlen( text );
  int i, p, endPos, indent, startIndent, endIndent;
  const char *c;
  unsigned int ch;
  char *paddedText = NULL;

  /* determine how many displayed character positions are covered */
  startIndent = mBuffer->count_displayed_characters( lineStart, startPos );
  indent = startIndent;
  for ( c = text; *c != '\0'; c += fl_utf8len1(*c) )
    indent++;
  endIndent = indent;

  /* find which characters to remove, and if necessary generate additional
   padding to make up for removed control characters at the end */
  indent = startIndent;
  for ( p = startPos; ; p=buffer()->next_char(p) ) {
    if ( p == buf->length() )
      break;
    ch = buf->char_at( p );
    if ( ch == '\n' )
      break;
    indent++;
    if ( indent == endIndent ) {
      p++;
      break;
    } else if ( indent > endIndent ) {
      if ( ch != '\t' ) {
        p++;
        paddedText = new char [ textLen + FL_TEXT_MAX_EXP_CHAR_LEN + 1 ];
        strcpy( paddedText, text );
        for ( i = 0; i < indent - endIndent; i++ )
          paddedText[ textLen + i ] = ' ';
        paddedText[ textLen + i ] = '\0';
      }
      break;
    }
  }
  endPos = p;

  mCursorToHint = startPos + textLen;
  buf->replace( startPos, endPos, paddedText == NULL ? text : paddedText );
  mCursorToHint = NO_HINT;
  if ( paddedText != NULL )
    delete [] paddedText;
}